

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hkdf.c
# Opt level: O3

int mbedtls_hkdf_expand(mbedtls_md_info_t *md,uchar *prk,size_t prk_len,uchar *info,size_t info_len,
                       uchar *okm,size_t okm_len)

{
  ulong uVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  size_t ilen;
  ulong uVar6;
  uchar c;
  mbedtls_md_context_t ctx;
  uchar t [64];
  uchar local_c1;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  uchar *local_a8;
  size_t local_a0;
  uchar *local_98;
  mbedtls_md_context_t local_90;
  uchar local_78 [72];
  
  iVar3 = -0x5f80;
  if (okm != (uchar *)0x0) {
    local_c0 = prk_len;
    local_98 = prk;
    bVar2 = mbedtls_md_get_size(md);
    uVar6 = (ulong)bVar2;
    if (bVar2 != 0 && uVar6 <= local_c0) {
      if (info == (uchar *)0x0) {
        info_len = 0;
      }
      local_a8 = "";
      if (info != (uchar *)0x0) {
        local_a8 = info;
      }
      uVar5 = (okm_len / uVar6 + 1) - (ulong)(okm_len % uVar6 == 0);
      if (uVar5 < 0x100) {
        local_a0 = info_len;
        mbedtls_md_init(&local_90);
        iVar3 = mbedtls_md_setup(&local_90,md,1);
        if (iVar3 == 0) {
          if (uVar5 != 0) {
            uVar4 = 1;
            ilen = 0;
            local_b8 = uVar5;
            do {
              local_c1 = (uchar)uVar4;
              local_b0 = uVar4;
              iVar3 = mbedtls_md_hmac_starts(&local_90,local_98,local_c0);
              if ((((iVar3 != 0) ||
                   (iVar3 = mbedtls_md_hmac_update(&local_90,local_78,ilen), iVar3 != 0)) ||
                  (iVar3 = mbedtls_md_hmac_update(&local_90,local_a8,local_a0), iVar3 != 0)) ||
                 (iVar3 = mbedtls_md_hmac_update(&local_90,&local_c1,1), iVar3 != 0))
              goto LAB_001052e1;
              iVar3 = mbedtls_md_hmac_finish(&local_90,local_78);
              uVar1 = local_b0;
              uVar5 = local_b8;
              if (iVar3 != 0) goto LAB_001052e1;
              uVar4 = uVar6;
              if (local_b8 == local_b0) {
                uVar4 = okm_len;
              }
              memcpy(okm,local_78,uVar4);
              uVar4 = uVar1 + 1;
              okm_len = okm_len - uVar6;
              okm = okm + uVar6;
              ilen = uVar6;
            } while (uVar1 < uVar5);
          }
          iVar3 = 0;
        }
LAB_001052e1:
        mbedtls_md_free(&local_90);
        mbedtls_platform_zeroize(local_78,0x40);
      }
    }
  }
  return iVar3;
}

Assistant:

int mbedtls_hkdf_expand( const mbedtls_md_info_t *md, const unsigned char *prk,
                         size_t prk_len, const unsigned char *info,
                         size_t info_len, unsigned char *okm, size_t okm_len )
{
    size_t hash_len;
    size_t where = 0;
    size_t n;
    size_t t_len = 0;
    size_t i;
    int ret = 0;
    mbedtls_md_context_t ctx;
    unsigned char t[MBEDTLS_MD_MAX_SIZE];

    if( okm == NULL )
    {
        return( MBEDTLS_ERR_HKDF_BAD_INPUT_DATA );
    }

    hash_len = mbedtls_md_get_size( md );

    if( prk_len < hash_len || hash_len == 0 )
    {
        return( MBEDTLS_ERR_HKDF_BAD_INPUT_DATA );
    }

    if( info == NULL )
    {
        info = (const unsigned char *) "";
        info_len = 0;
    }

    n = okm_len / hash_len;

    if( (okm_len % hash_len) != 0 )
    {
        n++;
    }

    /*
     * Per RFC 5869 Section 2.3, okm_len must not exceed
     * 255 times the hash length
     */
    if( n > 255 )
    {
        return( MBEDTLS_ERR_HKDF_BAD_INPUT_DATA );
    }

    mbedtls_md_init( &ctx );

    if( (ret = mbedtls_md_setup( &ctx, md, 1) ) != 0 )
    {
        goto exit;
    }

    /*
     * Compute T = T(1) | T(2) | T(3) | ... | T(N)
     * Where T(N) is defined in RFC 5869 Section 2.3
     */
    for( i = 1; i <= n; i++ )
    {
        size_t num_to_copy;
        unsigned char c = i & 0xff;

        ret = mbedtls_md_hmac_starts( &ctx, prk, prk_len );
        if( ret != 0 )
        {
            goto exit;
        }

        ret = mbedtls_md_hmac_update( &ctx, t, t_len );
        if( ret != 0 )
        {
            goto exit;
        }

        ret = mbedtls_md_hmac_update( &ctx, info, info_len );
        if( ret != 0 )
        {
            goto exit;
        }

        /* The constant concatenated to the end of each T(n) is a single octet.
         * */
        ret = mbedtls_md_hmac_update( &ctx, &c, 1 );
        if( ret != 0 )
        {
            goto exit;
        }

        ret = mbedtls_md_hmac_finish( &ctx, t );
        if( ret != 0 )
        {
            goto exit;
        }

        num_to_copy = i != n ? hash_len : okm_len - where;
        memcpy( okm + where, t, num_to_copy );
        where += hash_len;
        t_len = hash_len;
    }

exit:
    mbedtls_md_free( &ctx );
    mbedtls_platform_zeroize( t, sizeof( t ) );

    return( ret );
}